

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int nng_stream_listener_alloc(nng_stream_listener **lp,char *uri)

{
  int iVar1;
  nng_url *local_20;
  nng_url *url;
  
  iVar1 = nng_url_parse(&local_20,uri);
  if (iVar1 == 0) {
    iVar1 = nng_stream_listener_alloc_url(lp,local_20);
    nng_url_free(local_20);
  }
  return iVar1;
}

Assistant:

int
nng_stream_listener_alloc(nng_stream_listener **lp, const char *uri)
{
	nng_url *url;
	int      rv;

	if ((rv = nng_url_parse(&url, uri)) != 0) {
		return (rv);
	}
	rv = nng_stream_listener_alloc_url(lp, url);
	nng_url_free(url);
	return (rv);
}